

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  allocator local_21a;
  allocator local_219;
  string local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream e;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *exportName;
  cmGeneratorTarget *this_local;
  
  exportName = (char *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"EXPORT_NAME",&local_41);
  pcVar2 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pcVar2;
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    psVar4 = GetName_abi_cxx11_(this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar2,&local_79);
    bVar1 = cmGeneratorExpression::IsValidTargetName(&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pcVar2 = local_20;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_21a);
      std::allocator<char>::~allocator((allocator<char> *)&local_21a);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      poVar3 = std::operator<<((ostream *)local_1f8,"EXPORT_NAME property \"");
      poVar3 = std::operator<<(poVar3,local_20);
      poVar3 = std::operator<<(poVar3,"\" for \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,"\": is not valid.");
      std::__cxx11::ostringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar2,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_219);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  const char* exportName = this->GetProperty("EXPORT_NAME");

  if (exportName && *exportName) {
    if (!cmGeneratorExpression::IsValidTargetName(exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str().c_str());
      return "";
    }
    return exportName;
  }
  return this->GetName();
}